

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_discovery_lin.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* loader::discoverEnabledDrivers_abi_cxx11_(void)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *(*papcVar3) [4];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  string local_220 [8];
  string substr;
  allocator local_1f9;
  string local_1f8 [32];
  stringstream local_1d8 [8];
  stringstream ss;
  char *local_40;
  char *path;
  char **__end2;
  char **__begin2;
  char *(*__range2) [4];
  char *altDrivers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *enabledDrivers;
  
  altDrivers._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI);
  __range2 = (char *(*) [4])0x0;
  papcVar3 = (char *(*) [4])getenv("ZE_ENABLE_ALT_DRIVERS");
  if (papcVar3 == (char *(*) [4])0x0) {
    __begin2 = &knownDriverNames;
    path = spdlog::level::level_string_views;
    __range2 = (char *(*) [4])0x0;
    for (__end2 = &knownDriverNames; __end2 != (char **)path; __end2 = __end2 + 1) {
      local_40 = *__end2;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>(in_RDI,&local_40);
    }
  }
  else {
    __range2 = papcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,(char *)papcVar3,&local_1f9);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1d8,local_1f8,_Var2);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    while (bVar1 = std::ios::good(), (bVar1 & 1) != 0) {
      std::__cxx11::string::string(local_220);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1d8,local_220,',');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_220);
      std::__cxx11::string::~string(local_220);
    }
    std::__cxx11::stringstream::~stringstream(local_1d8);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<DriverLibraryPath> discoverEnabledDrivers() {
  std::vector<DriverLibraryPath> enabledDrivers;
  const char *altDrivers = nullptr;

  // ZE_ENABLE_ALT_DRIVERS is for development/debug only
  altDrivers = getenv("ZE_ENABLE_ALT_DRIVERS");
  if (altDrivers == nullptr) {
    for (auto path : knownDriverNames) {
      enabledDrivers.emplace_back(path);
    }
  } else {
    std::stringstream ss(altDrivers);
    while (ss.good()) {
      std::string substr;
      getline(ss, substr, ',');
      enabledDrivers.emplace_back(substr);
    }
  }
  return enabledDrivers;
}